

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O3

long __thiscall docopt::value::asLong(value *this)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  runtime_error *this_00;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->kind_ != String) {
    throwIfNotKind(this,Long);
    return (this->variant_).longValue;
  }
  __nptr = (char *)(this->variant_).longValue;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,(char **)&local_48,10);
  if (local_48._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stol");
  }
  else if (*piVar2 != 0x22) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if ((long)local_48._M_dataplus._M_p - (long)__nptr == (this->variant_).strValue._M_string_length
       ) {
      return lVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,&(this->variant_).strValue," contains non-numeric characters.");
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = std::__throw_out_of_range("stol");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((char)iVar1 != '\0') {
    __cxa_free_exception(piVar2);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

inline
	long value::asLong() const
	{
		// Attempt to convert a string to a long
		if (kind_ == Kind::String) {
			const std::string& str = variant_.strValue;
			std::size_t pos;
			const long ret = stol(str, &pos); // Throws if it can't convert
			if (pos != str.length()) {
				// The string ended in non-digits.
				throw std::runtime_error( str + " contains non-numeric characters.");
			}
			return ret;
		}
		throwIfNotKind(Kind::Long);
		return variant_.longValue;
	}